

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O1

void Function_Pool::Resize
               (Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,uint32_t heightIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,uint32_t heightOut
               )

{
  FunctionTask local_170;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,widthIn,heightIn);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,widthOut,heightOut);
  FunctionPoolTask::FunctionPoolTask(&local_170.super_FunctionPoolTask);
  local_170.super_FunctionPoolTask.super_TaskProviderSingleton.super_AbstractTaskProvider.
  _vptr_AbstractTaskProvider = (_func_int **)&PTR__FunctionTask_00201c18;
  local_170.functionId = _none;
  local_170._dataIn.minThreshold = '\0';
  local_170._dataIn.maxThreshold = 0xff;
  local_170._dataIn.horizontalProjection = false;
  local_170._dataIn.coefficientA = 1.0;
  local_170._dataIn.coefficientGamma = 1.0;
  local_170._dataIn.extractChannelId = 0xff;
  local_170._dataIn.lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataIn.lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataIn.lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._dataOut.histogram.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataOut.histogram.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataOut.histogram.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._dataOut.projection.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataOut.projection.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataOut.projection.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._dataOut.sum.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataOut.sum.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataOut.sum.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._dataOut.equality.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataOut.equality.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataOut.equality.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FunctionPoolTask::_setup
            (&local_170.super_FunctionPoolTask,in,startXIn,startYIn,widthIn,heightIn,out,startXOut,
             startYOut,widthOut,heightOut);
  local_170.functionId = _Resize;
  FunctionPoolTask::_processTask(&local_170.super_FunctionPoolTask);
  FunctionTask::~FunctionTask(&local_170);
  return;
}

Assistant:

void Resize( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                 Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        Image_Function::ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        Image_Function::ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );

        FunctionTask().Resize( in, startXIn, startYIn, widthIn, heightIn, out, startXOut, startYOut, widthOut, heightOut );
    }